

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.c
# Opt level: O2

gamewin * alloc_gamewin(wchar_t extra)

{
  gamewin *pgVar1;
  gamewin *pgVar2;
  
  pgVar2 = (gamewin *)calloc(1,(long)extra + 0x28);
  pgVar1 = pgVar2;
  if (firstgw != (gamewin *)0x0 || lastgw != (gamewin *)0x0) {
    lastgw->next = pgVar2;
    pgVar2->prev = lastgw;
    pgVar1 = firstgw;
  }
  firstgw = pgVar1;
  lastgw = pgVar2;
  return pgVar2;
}

Assistant:

struct gamewin *alloc_gamewin(int extra)
{
    struct gamewin *gw = malloc(sizeof(struct gamewin) + extra);
    memset(gw, 0, sizeof(struct gamewin) + extra);
    
    if (firstgw == NULL && lastgw == NULL)
	firstgw = lastgw = gw;
    else {
	lastgw->next = gw;
	gw->prev = lastgw;
	lastgw = gw;
    }
    
    return gw;
}